

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

xmlOutputBufferPtr xmlOutputBufferCreateFd(int fd,xmlCharEncodingHandlerPtr encoder)

{
  xmlOutputBufferPtr pxVar1;
  int *piVar2;
  
  if (fd < 0) {
    xmlCharEncCloseFunc(encoder);
  }
  else {
    pxVar1 = xmlAllocOutputBuffer(encoder);
    if ((pxVar1 != (xmlOutputBufferPtr)0x0) &&
       (piVar2 = (int *)(*xmlMalloc)(4), piVar2 != (int *)0x0)) {
      *piVar2 = fd;
      pxVar1->context = piVar2;
      pxVar1->writecallback = xmlFdWrite;
      pxVar1->closecallback = xmlFdFree;
      return pxVar1;
    }
  }
  return (xmlOutputBufferPtr)0x0;
}

Assistant:

xmlOutputBufferPtr
xmlOutputBufferCreateFd(int fd, xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    if (fd < 0) {
        xmlCharEncCloseFunc(encoder);
        return(NULL);
    }

    ret = xmlAllocOutputBuffer(encoder);
    if (ret != NULL) {
        xmlFdIOCtxt *fdctxt;

        fdctxt = xmlMalloc(sizeof(*fdctxt));
        if (fdctxt == NULL) {
            return(NULL);
        }
        fdctxt->fd = fd;

        ret->context = fdctxt;
	ret->writecallback = xmlFdWrite;
        ret->closecallback = xmlFdFree;
    }

    return(ret);
}